

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::DenseSupportVectors::ByteSizeLong(DenseSupportVectors *this)

{
  long lVar1;
  Rep *pRVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  void **ppvVar7;
  
  sVar5 = (size_t)(this->vectors_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->vectors_).super_RepeatedPtrFieldBase.rep_;
  ppvVar7 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar7 = (void **)0x0;
  }
  lVar1 = sVar5 * 8;
  for (lVar6 = 0; lVar1 - lVar6 != 0; lVar6 = lVar6 + 8) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::DenseVector>
                      (*(DenseVector **)((long)ppvVar7 + lVar6));
    sVar5 = sVar5 + sVar4;
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

size_t DenseSupportVectors::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.DenseSupportVectors)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.DenseVector vectors = 1;
  total_size += 1UL * this->_internal_vectors_size();
  for (const auto& msg : this->vectors_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}